

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevU.cpp
# Opt level: O0

void __thiscall OpenMD::ChebyshevU::GenerateFirstTwoTerms(ChebyshevU *this)

{
  DoublePolynomial u1;
  DoublePolynomial u0;
  double *coefficient;
  value_type *in_stack_ffffffffffffff78;
  value_type *__x;
  Polynomial<double> *in_stack_ffffffffffffff80;
  double local_38 [7];
  
  coefficient = local_38;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x3128ca);
  Polynomial<double>::setCoefficient
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),coefficient);
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Polynomial<double>::Polynomial((Polynomial<double> *)0x31290a);
  __x = (value_type *)0x4000000000000000;
  Polynomial<double>::setCoefficient(in_stack_ffffffffffffff80,0x40000000,coefficient);
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             in_stack_ffffffffffffff80,__x);
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x31294f);
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x312959);
  return;
}

Assistant:

void ChebyshevU::GenerateFirstTwoTerms() {
    DoublePolynomial u0;
    u0.setCoefficient(0, 1.0);
    polyList_.push_back(u0);

    DoublePolynomial u1;
    u1.setCoefficient(1, 2.0);
    polyList_.push_back(u1);
  }